

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.cpp
# Opt level: O0

result * baryonyx::make_result(result *__return_storage_ptr__,context_ptr *ctx,string *filename)

{
  bool bVar1;
  type ctx_00;
  istream local_228 [8];
  ifstream ifs;
  string *filename_local;
  context_ptr *ctx_local;
  result *ret;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)ctx);
  if (bVar1) {
    ctx_00 = std::unique_ptr<baryonyx::context,_void_(*)(baryonyx::context_*)>::operator*(ctx);
    info<std::__cxx11::string>(ctx_00,"solution reads from file {}\n",filename);
    std::ifstream::ifstream(local_228,(string *)filename,_S_in);
    result::result(__return_storage_ptr__);
    operator>>(local_228,__return_storage_ptr__);
    std::ifstream::~ifstream(local_228);
  }
  else {
    result::result(__return_storage_ptr__,empty_context);
  }
  return __return_storage_ptr__;
}

Assistant:

result
make_result(const baryonyx::context_ptr& ctx, const std::string& filename)
{
    if (ctx) {
        info(*ctx, "solution reads from file {}\n", filename);
        std::ifstream ifs(filename);
        result ret;
        ifs >> ret;
        return ret;
    }

    return result{ result_status::empty_context };
}